

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

string * __thiscall
util::str<char[16],std::__cxx11::string,char[3],char*>
          (string *__return_storage_ptr__,util *this,char (*args) [16],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [3],char **args_3)

{
  char *__s;
  size_t sVar1;
  ostringstream ss;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  sVar1 = strlen((char *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)this,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,*(char **)*args,*(long *)(*args + 8));
  sVar1 = strlen((char *)args_1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)args_1,sVar1);
  __s = *(char **)args_2;
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string str(const Args&... args) {
  std::ostringstream ss;
  detail::_str(ss, args...);
  return ss.str();
}